

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O3

bool __thiscall llama_grammar_parser::parse(llama_grammar_parser *this,char *src)

{
  _Rb_tree_color _Var1;
  pointer pvVar2;
  pointer pvVar3;
  _Base_ptr p_Var4;
  pointer plVar5;
  char *pos;
  _Base_ptr p_Var6;
  runtime_error *prVar7;
  long *plVar8;
  pointer pvVar9;
  long *plVar10;
  _Rb_tree_header *p_Var11;
  ulong uVar12;
  pointer plVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
LAB_00196568:
  do {
    uVar12 = (ulong)(byte)*src;
    if (0x23 < uVar12) {
LAB_0019659f:
      do {
        src = parse_rule(this,src);
      } while (*src != 0);
LAB_001965af:
      pvVar2 = (this->rules).
               super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (this->rules).
               super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pvVar2 != pvVar3) {
        p_Var4 = (this->symbol_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var11 = &(this->symbol_ids)._M_t._M_impl.super__Rb_tree_header;
        pvVar9 = pvVar2;
        do {
          plVar13 = (pvVar9->
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          plVar5 = (pvVar9->
                   super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (plVar13 == plVar5) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,"Undefined rule");
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          do {
            if (plVar13->type == LLAMA_GRETYPE_RULE_REF) {
              _Var1 = plVar13->value;
              uVar12 = (ulong)_Var1;
              p_Var6 = p_Var4;
              if ((ulong)(((long)pvVar3 - (long)pvVar2 >> 3) * -0x5555555555555555) <= uVar12)
              goto joined_r0x00196646;
              if (pvVar2[uVar12].
                  super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  pvVar2[uVar12].
                  super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
                  _M_impl.super__Vector_impl_data._M_finish && (_Rb_tree_header *)p_Var4 != p_Var11)
              {
                do {
                  if (p_Var6[2]._M_color == _Var1) {
                    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::operator+(&local_70,"Undefined rule identifier \'",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(p_Var6 + 1));
                    plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
                    local_50 = (long *)*plVar8;
                    plVar10 = plVar8 + 2;
                    if (local_50 == plVar10) {
                      local_40 = *plVar10;
                      lStack_38 = plVar8[3];
                      local_50 = &local_40;
                    }
                    else {
                      local_40 = *plVar10;
                    }
                    local_48 = plVar8[1];
                    *plVar8 = (long)plVar10;
                    plVar8[1] = 0;
                    *(undefined1 *)(plVar8 + 2) = 0;
                    std::runtime_error::runtime_error(prVar7,(string *)&local_50);
                    __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
joined_r0x00196646:
                } while ((_Rb_tree_header *)p_Var6 != p_Var11);
              }
            }
            plVar13 = plVar13 + 1;
          } while (plVar13 != plVar5);
          pvVar9 = pvVar9 + 1;
        } while (pvVar9 != pvVar3);
      }
      return true;
    }
    if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) {
      if (uVar12 != 0x23) {
        if (uVar12 == 0) goto LAB_001965af;
        goto LAB_0019659f;
      }
      while ((0xd < (byte)uVar12 || ((0x2401U >> ((uint)uVar12 & 0x1f) & 1) == 0))) {
        uVar12 = (ulong)((byte *)src)[1];
        src = (char *)((byte *)src + 1);
      }
      goto LAB_00196568;
    }
    src = (char *)((byte *)src + 1);
  } while( true );
}

Assistant:

bool llama_grammar_parser::parse(const char * src) {
    try {
        const char * pos = parse_space(src, true);
        while (*pos) {
            pos = parse_rule(pos);
        }
        // Validate the state to ensure that all rules are defined
        for (const auto & rule : rules) {
            if (rule.empty()) {
                throw std::runtime_error("Undefined rule");
            }
            for (const auto & elem : rule) {
                if (elem.type == LLAMA_GRETYPE_RULE_REF) {
                    // Ensure that the rule at that location exists
                    if (elem.value >= rules.size() || rules[elem.value].empty()) {
                        // Get the name of the rule that is missing
                        for (const auto & kv : symbol_ids) {
                            if (kv.second == elem.value) {
                                throw std::runtime_error("Undefined rule identifier '" + kv.first + "'");
                            }
                        }
                    }
                }
            }
        }
    } catch (const std::exception & err) {
        fprintf(stderr, "%s: error parsing grammar: %s\n\n%s\n", __func__, err.what(), src);
        rules.clear();
        return false;
    }

    return true;
}